

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdebug_p.h
# Opt level: O0

void QtDebugUtils::formatQRect<QRect>(QDebug *debug,QRect *rect)

{
  int iVar1;
  int iVar2;
  QDebug *this;
  QDebug *this_00;
  qint64 in_RDI;
  char *in_stack_00000018;
  qint64 M;
  qint64 h;
  qint64 w;
  QDebug *in_stack_ffffffffffffffc0;
  
  QRect::x((QRect *)0x629901);
  QDebug::operator<<(in_stack_ffffffffffffffc0,(int)((ulong)in_RDI >> 0x20));
  this = QDebug::operator<<(in_stack_ffffffffffffffc0,(char)((ulong)in_RDI >> 0x38));
  QRect::y((QRect *)0x629928);
  QDebug::operator<<(this,(int)((ulong)in_RDI >> 0x20));
  QDebug::operator<<(this,(char)((ulong)in_RDI >> 0x38));
  iVar1 = QRect::right((QRect *)0x62994b);
  iVar2 = QRect::left((QRect *)0x62995c);
  this_00 = (QDebug *)(((long)iVar1 - (long)iVar2) + 1);
  iVar1 = QRect::bottom((QRect *)0x62997c);
  iVar2 = QRect::top((QRect *)0x62998d);
  QDebug::operator<<(this,in_RDI);
  QDebug::operator<<(this,(char)((ulong)in_RDI >> 0x38));
  QDebug::operator<<(this,in_RDI);
  if ((0x7fffffff < (long)this_00) || (0x7fffffff < ((long)iVar1 - (long)iVar2) + 1)) {
    QDebug::operator<<(this_00,in_stack_00000018);
  }
  return;
}

Assistant:

static inline void formatQRect(QDebug &debug, const Rect &rect)
{
    debug << rect.x() << ',' << rect.y() << ' ';
    if constexpr (std::is_same_v<Rect, QRect>) {
        // QRect may overflow. Calculate width and height in higher precision.
        const qint64 w = qint64(rect.right()) - rect.left() + 1;
        const qint64 h = qint64(rect.bottom()) - rect.top() + 1;
        debug << w << 'x' << h;

        constexpr qint64 M = (std::numeric_limits<int>::max)();
        if (w > M || h > M)
            debug << " (oversized)";
    } else {
        debug << rect.width() << 'x' << rect.height();
    }
}